

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

int pzshape::TPZShapeQuad::GetTransformId2dQ(TPZVec<long> *id)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  plVar1 = id->fStore;
  lVar2 = *plVar1;
  lVar3 = plVar1[1];
  lVar4 = plVar1[2];
  lVar5 = plVar1[3];
  uVar8 = (ulong)(lVar4 < lVar5 ^ 3);
  if (plVar1[lVar3 <= lVar2] < plVar1[uVar8]) {
    uVar8 = (ulong)(lVar3 <= lVar2);
  }
  lVar7 = (long)(int)plVar1[uVar8];
  if (plVar1[(int)uVar8 + 1U & 3] < plVar1[(int)uVar8 - 1U & 3]) {
    if (lVar7 == lVar2) {
      return 0;
    }
    if (lVar7 == lVar3) {
      iVar6 = 2;
    }
    else if (lVar7 == lVar4) {
      iVar6 = 4;
    }
    else {
      if (lVar7 != lVar5) {
        return 0;
      }
      iVar6 = 6;
    }
  }
  else if (lVar7 == lVar2) {
    iVar6 = 1;
  }
  else if (lVar7 == lVar3) {
    iVar6 = 3;
  }
  else if (lVar7 == lVar4) {
    iVar6 = 5;
  }
  else {
    if (lVar7 != lVar5) {
      return 0;
    }
    iVar6 = 7;
  }
  return iVar6;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}